

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::FileDescriptor::Copy(FileDescriptor *this,FileDescriptor *rhs)

{
  FileDescriptor *rhs_local;
  FileDescriptor *this_local;
  
  GenericDescriptor::Copy(&this->super_GenericDescriptor,&rhs->super_GenericDescriptor);
  (this->LinkedTrackID).m_property = (rhs->LinkedTrackID).m_property;
  (this->LinkedTrackID).m_has_value = (rhs->LinkedTrackID).m_has_value;
  Rational::operator=(&this->SampleRate,&rhs->SampleRate);
  (this->ContainerDuration).m_property = (rhs->ContainerDuration).m_property;
  (this->ContainerDuration).m_has_value = (rhs->ContainerDuration).m_has_value;
  UL::operator=(&this->EssenceContainer,&rhs->EssenceContainer);
  optional_property<ASDCP::UL>::operator=(&this->Codec,&rhs->Codec);
  return;
}

Assistant:

void
FileDescriptor::Copy(const FileDescriptor& rhs)
{
  GenericDescriptor::Copy(rhs);
  LinkedTrackID = rhs.LinkedTrackID;
  SampleRate = rhs.SampleRate;
  ContainerDuration = rhs.ContainerDuration;
  EssenceContainer = rhs.EssenceContainer;
  Codec = rhs.Codec;
}